

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

QList<QPointer<QObject>_> * __thiscall
QPointerEvent::passiveGrabbers
          (QList<QPointer<QObject>_> *__return_storage_ptr__,QPointerEvent *this,QEventPoint *point)

{
  QPointingDevicePrivate *this_00;
  Data *pDVar1;
  int id;
  EventPointData *pEVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug local_48;
  QEventPoint local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPointingDevicePrivate **)&((this->super_QInputEvent).m_dev)->field_0x8;
  id = QEventPoint::id(point);
  pEVar2 = QPointingDevicePrivate::queryPointById(this_00,id);
  if (pEVar2 == (EventPointData *)0x0) {
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_48,"point is not in activePoints");
    local_40.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)pQVar3->stream;
    *(int *)((long)local_40.d.d.ptr + 0x28) = *(int *)((long)local_40.d.d.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_38,&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QPointer<QObject> *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (pEVar2->passiveGrabbers).d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pEVar2->passiveGrabbers).d.ptr;
    (__return_storage_ptr__->d).size = (pEVar2->passiveGrabbers).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPointer<QObject> > QPointerEvent::passiveGrabbers(const QEventPoint &point) const
{
    Q_ASSERT(pointingDevice());
    auto persistentPoint = QPointingDevicePrivate::get(pointingDevice())->queryPointById(point.id());
    if (Q_UNLIKELY(!persistentPoint)) {
        qWarning() << "point is not in activePoints" << point;
        return {};
    }
    return persistentPoint->passiveGrabbers;
}